

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall xLearn::Solver::init_predict(Solver *this)

{
  string *psVar1;
  string *psVar2;
  Reader *pRVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  Reader *pRVar5;
  uint uVar6;
  int iVar7;
  ThreadPool *this_00;
  ostream *poVar8;
  Model *this_01;
  Score *pSVar9;
  Loss *this_02;
  size_t sVar10;
  Timer *this_03;
  ulong threads;
  float fVar11;
  Modifier reset_1;
  Modifier green;
  Timer timer;
  Modifier reset_9;
  undefined1 local_7c [4];
  undefined1 local_78 [32];
  string local_58;
  Timer local_38;
  Modifier local_24;
  
  uVar6 = std::thread::hardware_concurrency();
  sVar10 = (size_t)(this->hyper_param_).thread_number;
  threads = (ulong)uVar6;
  if (sVar10 != 0) {
    threads = sVar10;
  }
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,threads);
  this->pool_ = this_00;
  StringPrintf_abi_cxx11_((string *)local_78,"xLearn uses %i threads for prediction task.",threads);
  local_38.begin.__d.__r._0_4_ = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
  poVar8 = Color::operator<<(poVar8,(Modifier *)&local_38);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_78._0_8_,local_78._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pRVar3 = (Reader *)(local_78 + 0x10);
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  local_78._0_8_ = pRVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Load model ...","");
  local_38.begin.__d.__r._0_4_ = 1;
  local_7c = (undefined1  [4])0x0;
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
  poVar8 = Color::operator<<(poVar8,(Modifier *)&local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ACTION     ] ",0xf);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_78._0_8_,local_78._8_8_);
  poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  if ((this->hyper_param_).model_file._M_string_length == 0) {
    local_38.begin.__d.__r._0_4_ = 2;
    local_78._0_8_ = pRVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,"");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"init_predict","");
    poVar8 = Logger::Start(ERR,(string *)local_78,0x1a1,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1a1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"hyper_param_.model_file.empty()",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    std::operator<<(poVar8,"\n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)local_78);
    this_03 = &local_38;
    goto LAB_00149cfa;
  }
  psVar2 = &(this->hyper_param_).model_file;
  StringPrintf_abi_cxx11_((string *)local_78,"Load model from %s",(psVar2->_M_dataplus)._M_p);
  local_38.begin.__d.__r._0_4_ = 0;
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
  poVar8 = Color::operator<<(poVar8,(Modifier *)&local_38);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_78._0_8_,local_78._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  Timer::Timer(&local_38);
  Timer::tic(&local_38);
  this_01 = (Model *)operator_new(0x90);
  Model::Model(this_01,psVar2);
  psVar2 = &(this->hyper_param_).score_func;
  this->model_ = this_01;
  std::__cxx11::string::_M_assign((string *)psVar2);
  psVar1 = &(this->hyper_param_).loss_func;
  std::__cxx11::string::_M_assign((string *)psVar1);
  (this->hyper_param_).num_feature = this->model_->num_feat_;
  iVar7 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar7 == 0) {
LAB_00148f88:
    (this->hyper_param_).num_K = this->model_->num_K_;
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar7 == 0) goto LAB_00148f88;
  }
  iVar7 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar7 == 0) {
    (this->hyper_param_).num_field = this->model_->num_field_;
  }
  StringPrintf_abi_cxx11_((string *)local_78,"Loss function: %s",(psVar1->_M_dataplus)._M_p);
  local_7c = (undefined1  [4])0x0;
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
  poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_78._0_8_,local_78._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  StringPrintf_abi_cxx11_((string *)local_78,"Score function: %s",(psVar2->_M_dataplus)._M_p);
  local_7c = (undefined1  [4])0x0;
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
  poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_78._0_8_,local_78._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  StringPrintf_abi_cxx11_
            ((string *)local_78,"Number of Feature: %d",(ulong)(this->hyper_param_).num_feature);
  local_7c = (undefined1  [4])0x0;
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
  poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_78._0_8_,local_78._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  iVar7 = std::__cxx11::string::compare((char *)psVar2);
  if (iVar7 == 0) {
LAB_001491d4:
    StringPrintf_abi_cxx11_((string *)local_78,"Number of K: %d",(ulong)(this->hyper_param_).num_K);
    local_7c = (undefined1  [4])0x0;
    local_58._M_dataplus._M_p._0_4_ = 0x20;
    poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
    poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_78._0_8_,local_78._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((Reader *)local_78._0_8_ != pRVar3) {
      operator_delete((void *)local_78._0_8_);
    }
    iVar7 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar7 == 0) {
      StringPrintf_abi_cxx11_
                ((string *)local_78,"Number of field: %d",(ulong)(this->hyper_param_).num_field);
      local_7c = (undefined1  [4])0x0;
      local_58._M_dataplus._M_p._0_4_ = 0x20;
      poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
      poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(char *)local_78._0_8_,local_78._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((Reader *)local_78._0_8_ != pRVar3) {
        operator_delete((void *)local_78._0_8_);
      }
    }
  }
  else {
    iVar7 = std::__cxx11::string::compare((char *)psVar2);
    if (iVar7 == 0) goto LAB_001491d4;
  }
  fVar11 = Timer::toc(&local_38);
  StringPrintf_abi_cxx11_
            ((string *)local_78,"Time cost for loading model: %.2f (sec)",(double)fVar11);
  local_7c = (undefined1  [4])0x0;
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
  poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_78._0_8_,local_78._8_8_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  local_7c = (undefined1  [4])0x0;
  local_78._0_8_ = pRVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
             ,"");
  paVar4 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"init_predict","");
  poVar8 = Logger::Start(INFO,(string *)local_78,0x1d0,&local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Initialize model.",0x11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar4) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  Logger::~Logger((Logger *)local_7c);
  local_78._0_8_ = pRVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"Read Problem ...","");
  local_7c = (undefined1  [4])0x1;
  local_24.code = RESET;
  local_58._M_dataplus._M_p._0_4_ = 0x20;
  poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
  poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[ ACTION     ] ",0xf);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(char *)local_78._0_8_,local_78._8_8_);
  poVar8 = Color::operator<<(poVar8,&local_24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  if ((Reader *)local_78._0_8_ != pRVar3) {
    operator_delete((void *)local_78._0_8_);
  }
  Timer::reset(&local_38);
  Timer::tic(&local_38);
  local_78._0_8_ = create_reader(this);
  std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::resize
            (&this->reader_,1,(value_type *)local_78);
  if ((this->hyper_param_).from_file == true) {
    if ((this->hyper_param_).test_set_file._M_string_length != 0) {
      psVar2 = &(this->hyper_param_).test_set_file;
      Reader::SetBlockSize
                (*(this->reader_).
                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(long)(this->hyper_param_).block_size);
      pRVar5 = *(this->reader_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*pRVar5->_vptr_Reader[2])(pRVar5,psVar2);
      pRVar5 = *(this->reader_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*pRVar5->_vptr_Reader[8])(pRVar5,0);
      if (*(this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
           _M_impl.super__Vector_impl_data._M_start != (Reader *)0x0) {
LAB_0014966c:
        fVar11 = Timer::toc(&local_38);
        StringPrintf_abi_cxx11_
                  ((string *)local_78,"Time cost for reading problem: %.2f (sec)",(double)fVar11);
        local_7c = (undefined1  [4])0x0;
        local_58._M_dataplus._M_p._0_4_ = 0x20;
        poVar8 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[------------] ",0xf);
        poVar8 = Color::operator<<(poVar8,(Modifier *)local_7c);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(char *)local_78._0_8_,local_78._8_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((Reader *)local_78._0_8_ != pRVar3) {
          operator_delete((void *)local_78._0_8_);
        }
        local_7c = (undefined1  [4])0x0;
        local_78._0_8_ = pRVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                   ,"");
        local_58._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"init_predict","");
        poVar8 = Logger::Start(INFO,(string *)local_78,0x1f6,&local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Initialize Reader: ",0x13);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,(this->hyper_param_).test_set_file._M_dataplus._M_p,
                   (this->hyper_param_).test_set_file._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar4) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((Reader *)local_78._0_8_ != pRVar3) {
          operator_delete((void *)local_78._0_8_);
        }
        Logger::~Logger((Logger *)local_7c);
        pSVar9 = create_score(this);
        this->score_ = pSVar9;
        local_7c = (undefined1  [4])0x0;
        local_78._0_8_ = pRVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                   ,"");
        local_58._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"init_predict","");
        poVar8 = Logger::Start(INFO,(string *)local_78,0x1fb,&local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Initialize score function.",0x1a)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar4) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((Reader *)local_78._0_8_ != pRVar3) {
          operator_delete((void *)local_78._0_8_);
        }
        Logger::~Logger((Logger *)local_7c);
        this_02 = create_loss(this);
        this->loss_ = this_02;
        Loss::Initialize(this_02,this->score_,this->pool_,(this->hyper_param_).norm,false,0);
        local_7c = (undefined1  [4])0x0;
        local_78._0_8_ = pRVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
                   ,"");
        local_58._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"init_predict","");
        poVar8 = Logger::Start(INFO,(string *)local_78,0x201,&local_58);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Initialize score function.",0x1a)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar4) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((Reader *)local_78._0_8_ != pRVar3) {
          operator_delete((void *)local_78._0_8_);
        }
        Logger::~Logger((Logger *)local_7c);
        return;
      }
      StringPrintf_abi_cxx11_
                ((string *)local_78,"Cannot open the file %s",(psVar2->_M_dataplus)._M_p);
      Color::print_info((string *)local_78,false);
LAB_00149d2b:
      std::__cxx11::string::~string((string *)local_78);
      exit(0);
    }
    local_7c = (undefined1  [4])0x2;
    local_78._0_8_ = pRVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,"");
    local_58._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"init_predict","");
    poVar8 = Logger::Start(ERR,(string *)local_78,0x1da,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"CHECK_NE failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1da);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"hyper_param_.test_set_file.empty()",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"true",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
    poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
    std::operator<<(poVar8,"\n");
  }
  else {
    if ((this->hyper_param_).test_dataset != (DMatrix *)0x0) {
      Reader::SetBlockSize
                (*(this->reader_).
                  super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                  super__Vector_impl_data._M_start,(long)(this->hyper_param_).block_size);
      pRVar5 = *(this->reader_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*pRVar5->_vptr_Reader[3])(pRVar5,&(this->hyper_param_).test_dataset);
      pRVar5 = *(this->reader_).
                super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      (*pRVar5->_vptr_Reader[8])(pRVar5,0);
      if (*(this->reader_).super__Vector_base<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>.
           _M_impl.super__Vector_impl_data._M_start != (Reader *)0x0) goto LAB_0014966c;
      StringPrintf_abi_cxx11_
                ((string *)local_78,"Cannot open the file %s",
                 (this->hyper_param_).test_set_file._M_dataplus._M_p);
      Color::print_info((string *)local_78,false);
      goto LAB_00149d2b;
    }
    local_7c = (undefined1  [4])0x2;
    local_78._0_8_ = pRVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,"");
    local_58._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"init_predict","");
    poVar8 = Logger::Start(ERR,(string *)local_78,0x1e6,&local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"CHECK failed ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,0x57);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,0x1e6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"hyper_param_.test_dataset",0x19);
    std::operator<<(poVar8," == NULL \n");
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_78);
  this_03 = (Timer *)local_7c;
LAB_00149cfa:
  Logger::~Logger((Logger *)this_03);
  abort();
}

Assistant:

void Solver::init_predict() {
  /*********************************************************
   *  Initialize thread pool                               *
   *********************************************************/
  size_t threadNumber = std::thread::hardware_concurrency();
  if (hyper_param_.thread_number != 0) {
    threadNumber = hyper_param_.thread_number;
  }
  pool_ = new ThreadPool(threadNumber);
  Color::print_info(
    StringPrintf("xLearn uses %i threads for prediction task.",
             threadNumber)
  );
  /*********************************************************
   *  Read model file                                      *
   *********************************************************/
  Color::print_action("Load model ...");
  CHECK_NE(hyper_param_.model_file.empty(), true);
  Color::print_info(
    StringPrintf("Load model from %s",
          hyper_param_.model_file.c_str())
  );
  Timer timer;
  timer.tic();
  model_ = new Model(hyper_param_.model_file);
  hyper_param_.score_func = model_->GetScoreFunction();
  hyper_param_.loss_func = model_->GetLossFunction();
  hyper_param_.num_feature = model_->GetNumFeature();
  if (hyper_param_.score_func.compare("fm") == 0 ||
       hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_K = model_->GetNumK();
  }
  if (hyper_param_.score_func.compare("ffm") == 0) {
    hyper_param_.num_field = model_->GetNumField();
  }
  Color::print_info(
    StringPrintf("Loss function: %s", 
      hyper_param_.loss_func.c_str())
  );
  Color::print_info(
    StringPrintf("Score function: %s", 
      hyper_param_.score_func.c_str())
  );
  Color::print_info(
    StringPrintf("Number of Feature: %d", 
                 hyper_param_.num_feature)
  );
  if (hyper_param_.score_func.compare("fm") == 0 ||
      hyper_param_.score_func.compare("ffm") == 0) {
    Color::print_info(
      StringPrintf("Number of K: %d", 
                   hyper_param_.num_K)
    );
    if (hyper_param_.score_func.compare("ffm") == 0) {
      Color::print_info(
        StringPrintf("Number of field: %d", 
                    hyper_param_.num_field)
      );
    }
  }
  Color::print_info(
    StringPrintf("Time cost for loading model: %.2f (sec)",
        timer.toc())
  );
  LOG(INFO) << "Initialize model.";
  /*********************************************************
   *  Initialize Reader and read problem                   *
   *********************************************************/
  Color::print_action("Read Problem ...");
  timer.reset();
  timer.tic();
  // Create Reader
  reader_.resize(1, create_reader());
  if (hyper_param_.from_file) {
    CHECK_NE(hyper_param_.test_set_file.empty(), true);
    reader_[0]->SetBlockSize(hyper_param_.block_size);
    reader_[0]->Initialize(hyper_param_.test_set_file);
    reader_[0]->SetShuffle(false);
    if (reader_[0] == nullptr) {
    Color::print_info(
      StringPrintf("Cannot open the file %s",
                  hyper_param_.test_set_file.c_str())
    );
    exit(0);
    }
  } else {
    CHECK_NOTNULL(hyper_param_.test_dataset)
    reader_[0]->SetBlockSize(hyper_param_.block_size);
    reader_[0]->Initialize(hyper_param_.test_dataset);
    reader_[0]->SetShuffle(false);
    if (reader_[0] == nullptr) {
    Color::print_info(
      StringPrintf("Cannot open the file %s",
                  hyper_param_.test_set_file.c_str())
    );
    exit(0);
    }
  }
  Color::print_info(
    StringPrintf("Time cost for reading problem: %.2f (sec)",
                  timer.toc())
  );
  LOG(INFO) << "Initialize Reader: " << hyper_param_.test_set_file;
  /*********************************************************
   *  Init score function                                  *
   *********************************************************/
  score_ = create_score();
  LOG(INFO) << "Initialize score function.";
  /*********************************************************
   *  Init loss function                                   *
   *********************************************************/
  loss_ = create_loss();
  loss_->Initialize(score_, pool_, hyper_param_.norm);
  LOG(INFO) << "Initialize score function.";
}